

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcompleter.cpp
# Opt level: O2

void __thiscall QCompleter::complete(QCompleter *this,QRect *rect)

{
  CompletionMode CVar1;
  QCompleterPrivate *this_00;
  QModelIndex index;
  QModelIndex index_00;
  Representation RVar2;
  Representation RVar3;
  Representation RVar4;
  int iVar5;
  long in_FS_OFFSET;
  undefined1 *local_38;
  undefined1 *puStack_30;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QCompleterPrivate **)&this->field_0x8;
  local_28.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  QCompletionModel::currentIndex((QModelIndex *)&local_38,this_00->proxy,false);
  this_00->hiddenBecauseNoMatch = false;
  CVar1 = this_00->mode;
  if (CVar1 == InlineCompletion) {
    if (((-1 < (int)local_38) && (-1 < (long)local_38)) &&
       (local_28.ptr != (QAbstractItemModel *)0x0)) {
      index.i = (quintptr)puStack_30;
      index._0_8_ = local_38;
      index.m.ptr = local_28.ptr;
      QCompleterPrivate::_q_complete(this_00,index,true);
    }
    goto LAB_005d3cbf;
  }
  if (CVar1 == UnfilteredPopupCompletion) {
    iVar5 = (**(code **)(*(long *)this_00->proxy + 0x78))();
    if (iVar5 != 0) goto LAB_005d3c7b;
  }
  else if ((CVar1 != PopupCompletion) ||
          (((-1 < (int)local_38 && (-1 < (long)local_38)) &&
           (local_28.ptr != (QAbstractItemModel *)0x0)))) {
LAB_005d3c7b:
    popup(this);
    if (this_00->mode == UnfilteredPopupCompletion) {
      index_00.i = (quintptr)puStack_30;
      index_00._0_8_ = local_38;
      index_00.m.ptr = local_28.ptr;
      QCompleterPrivate::setCurrentIndex(this_00,index_00,false);
    }
    QCompleterPrivate::showPopup(this_00,rect);
    RVar2.m_i = (rect->y1).m_i;
    RVar3.m_i = (rect->x2).m_i;
    RVar4.m_i = (rect->y2).m_i;
    (this_00->popupRect).x1 = (Representation)(rect->x1).m_i;
    (this_00->popupRect).y1 = (Representation)RVar2.m_i;
    (this_00->popupRect).x2 = (Representation)RVar3.m_i;
    (this_00->popupRect).y2 = (Representation)RVar4.m_i;
    goto LAB_005d3cbf;
  }
  if ((QWidget *)this_00->popup != (QWidget *)0x0) {
    QWidget::hide((QWidget *)this_00->popup);
  }
  this_00->hiddenBecauseNoMatch = true;
LAB_005d3cbf:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCompleter::complete(const QRect& rect)
{
    Q_D(QCompleter);
    QModelIndex idx = d->proxy->currentIndex(false);
    d->hiddenBecauseNoMatch = false;
    if (d->mode == QCompleter::InlineCompletion) {
        if (idx.isValid())
            d->_q_complete(idx, true);
        return;
    }

    Q_ASSERT(d->widget);
    if ((d->mode == QCompleter::PopupCompletion && !idx.isValid())
        || (d->mode == QCompleter::UnfilteredPopupCompletion && d->proxy->rowCount() == 0)) {
        if (d->popup)
            d->popup->hide(); // no suggestion, hide
        d->hiddenBecauseNoMatch = true;
        return;
    }

    popup();
    if (d->mode == QCompleter::UnfilteredPopupCompletion)
        d->setCurrentIndex(idx, false);

    d->showPopup(rect);
    d->popupRect = rect;
}